

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_manager.hpp
# Opt level: O1

void __thiscall
duckdb::BlockManager::SetBlockAllocSize(BlockManager *this,optional_idx block_alloc_size_p)

{
  idx_t index;
  InternalException *this_00;
  optional_idx local_48;
  string local_40;
  
  local_48.index = block_alloc_size_p.index;
  if ((this->block_alloc_size).index == 0xffffffffffffffff) {
    index = optional_idx::GetIndex(&local_48);
    optional_idx::optional_idx((optional_idx *)&local_40,index);
    (this->block_alloc_size).index = (idx_t)local_40._M_dataplus._M_p;
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"the block allocation size must be set once","");
  InternalException::InternalException(this_00,&local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void SetBlockAllocSize(const optional_idx block_alloc_size_p) {
		if (block_alloc_size.IsValid()) {
			throw InternalException("the block allocation size must be set once");
		}
		block_alloc_size = block_alloc_size_p.GetIndex();
	}